

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnCatch(TypeChecker *this)

{
  LabelType LVar1;
  Result RVar2;
  Result RVar3;
  Label *in_RAX;
  Enum EVar4;
  Label *local_38;
  Label *label;
  
  local_38 = in_RAX;
  RVar2 = TopLabel(this,&local_38);
  if (RVar2.enum_ == Error) {
    EVar4 = Error;
  }
  else {
    LVar1 = local_38->label_type;
    RVar2 = PopAndCheckSignature(this,&local_38->result_types,"try block");
    RVar3 = CheckTypeStackEnd(this,"try block");
    EVar4 = (Enum)((RVar3.enum_ == Error || RVar2.enum_ == Error) || LVar1 != Try);
    ResetTypeStackToLabel(this,local_38);
    local_38->label_type = Catch;
    local_38->unreachable = false;
    PushType(this,ExceptRef);
  }
  return (Result)EVar4;
}

Assistant:

Result TypeChecker::OnCatch() {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  result |= CheckLabelType(label, LabelType::Try);
  result |= PopAndCheckSignature(label->result_types, "try block");
  result |= CheckTypeStackEnd("try block");
  ResetTypeStackToLabel(label);
  label->label_type = LabelType::Catch;
  label->unreachable = false;
  PushType(Type::ExceptRef);
  return result;
}